

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

Slice leveldb::test::CompressibleString
                (Random *rnd,double compressed_fraction,size_t len,string *dst)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  string local_60 [8];
  string raw_data;
  int local_3c;
  int raw;
  string *dst_local;
  size_t len_local;
  double compressed_fraction_local;
  Random *rnd_local;
  
  auVar2._8_4_ = (int)(len >> 0x20);
  auVar2._0_8_ = len;
  auVar2._12_4_ = 0x45300000;
  local_3c = (int)(((auVar2._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0)) *
                  compressed_fraction);
  if (local_3c < 1) {
    local_3c = 1;
  }
  std::__cxx11::string::string(local_60);
  RandomString(rnd,local_3c,(string *)local_60);
  std::__cxx11::string::clear();
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (len <= uVar1) break;
    std::__cxx11::string::append((string *)dst);
  }
  std::__cxx11::string::resize((ulong)dst);
  Slice::Slice((Slice *)&rnd_local,dst);
  std::__cxx11::string::~string(local_60);
  return _rnd_local;
}

Assistant:

Slice CompressibleString(Random* rnd, double compressed_fraction, size_t len,
                         std::string* dst) {
  int raw = static_cast<int>(len * compressed_fraction);
  if (raw < 1) raw = 1;
  std::string raw_data;
  RandomString(rnd, raw, &raw_data);

  // Duplicate the random data until we have filled "len" bytes
  dst->clear();
  while (dst->size() < len) {
    dst->append(raw_data);
  }
  dst->resize(len);
  return Slice(*dst);
}